

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint Catch::rngSeed(void)

{
  int iVar1;
  uint uVar2;
  IContext *pIVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  
  pIVar3 = getCurrentContext();
  iVar1 = (*pIVar3->_vptr_IContext[4])();
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(extraout_var,iVar1));
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x11])();
  return uVar2;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }